

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O0

void __thiscall
asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>
          (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *this,
          basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *arg,context *ctx)

{
  context *in_RDX;
  undefined8 in_RSI;
  noncopyable *in_RDI;
  any_io_executor *in_stack_00000020;
  SSL_CTX *in_stack_00000028;
  stream_core *in_stack_00000030;
  
  asio::detail::noncopyable::noncopyable(in_RDI);
  *(undefined8 *)in_RDI = in_RSI;
  ssl::context::native_handle(in_RDX);
  basic_socket<asio::ip::tcp,_asio::any_io_executor>::lowest_layer
            (*(basic_socket<asio::ip::tcp,_asio::any_io_executor> **)in_RDI);
  basic_socket<asio::ip::tcp,_asio::any_io_executor>::get_executor
            ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)in_RDI);
  detail::stream_core::stream_core<asio::any_io_executor>
            (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  any_io_executor::~any_io_executor((any_io_executor *)0x253aa8);
  return;
}

Assistant:

stream(Arg&& arg, context& ctx)
    : next_layer_(ASIO_MOVE_CAST(Arg)(arg)),
      core_(ctx.native_handle(), next_layer_.lowest_layer().get_executor())
  {
  }